

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O1

void __thiscall Js::AsmJsFunc::ReleaseLocationGeneric(AsmJsFunc *this,EmitExpressionInfo *pnode)

{
  Which WVar1;
  RegSlot tmpReg;
  Types type;
  RegisterSpace *this_00;
  
  if (pnode != (EmitExpressionInfo *)0x0) {
    WVar1 = (pnode->type).which_;
    if ((WVar1 == Intish) || ((WVar1 < Intish & (byte)(0xe01 >> ((byte)WVar1 & 0x1f))) != 0)) {
      type = WAsmJs::FromPrimitiveType<int>();
    }
    else {
      if (Floatish < WVar1) {
        return;
      }
      if ((0x34U >> (WVar1 & (Float64x2|Floatish)) & 1) == 0) {
        if ((200U >> (WVar1 & (Float64x2|Floatish)) & 1) == 0) {
          return;
        }
        type = WAsmJs::FromPrimitiveType<float>();
      }
      else {
        type = WAsmJs::FromPrimitiveType<double>();
      }
    }
    this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&this->mTypedRegisterAllocator,type);
    tmpReg = (pnode->super_EmitInfoBase).location;
    if (tmpReg != 0xffffffff) {
      WAsmJs::RegisterSpace::ReleaseTmpRegister(this_00,tmpReg);
      return;
    }
  }
  return;
}

Assistant:

void AsmJsFunc::ReleaseLocationGeneric(const EmitExpressionInfo* pnode)
    {
        if (pnode)
        {
            if (pnode->type.isIntish())
            {
                ReleaseLocation<int>(pnode);
            }
            else if (pnode->type.isMaybeDouble())
            {
                ReleaseLocation<double>(pnode);
            }
            else if (pnode->type.isFloatish())
            {
                ReleaseLocation<float>(pnode);
            }
        }
    }